

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

double __thiscall
VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound(VariationalBayesEstimatorOnLDA *this)

{
  double __x;
  uint uVar1;
  pointer pvVar2;
  longdouble lVar3;
  pointer puVar4;
  lanczos17m64 *in_RCX;
  int *in_R8;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar10;
  longdouble in_ST5;
  longdouble lVar11;
  double dVar12;
  detail local_12a;
  undefined1 local_129;
  longdouble local_128;
  longdouble local_118;
  detail local_10a;
  undefined1 local_109;
  longdouble local_108;
  detail local_fe;
  undefined1 local_fd [2];
  undefined1 local_fb [2];
  undefined1 local_f9;
  double local_f8;
  double local_f0;
  longdouble local_e4;
  ulong local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_f8 = 0.0;
  local_f0 = 0.0;
  if (this->_K != 0) {
    local_f0 = 0.0;
    uVar5 = 0;
    local_118 = (longdouble)1.79769313486232e+308;
    do {
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_129,&local_12a,(longdouble)this->_betaSum,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar8 = ABS(in_ST0);
      dVar12 = 0.0;
      if (local_118 < lVar8) {
        local_128 = in_ST0;
        local_108 = lVar8;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        dVar12 = (double)local_128;
        lVar8 = local_108;
        in_ST0 = local_128;
        local_38 = dVar12;
      }
      local_40 = (double)in_ST0;
      if (lVar8 <= local_118) {
        dVar12 = local_40;
      }
      local_128 = (longdouble)CONCAT28(local_128._8_2_,dVar12);
      local_48 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5] + this->_betaSum;
      lVar10 = in_ST5;
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_129,&local_12a,(longdouble)local_48,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar8 = ABS(in_ST1);
      dVar12 = 0.0;
      lVar9 = in_ST1;
      in_ST0 = in_ST2;
      lVar3 = in_ST3;
      lVar11 = in_ST4;
      if (local_118 < lVar8) {
        local_108 = in_ST1;
        local_e4 = lVar8;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        dVar12 = (double)local_108;
        lVar8 = local_e4;
        lVar9 = local_108;
        in_ST0 = in_ST2;
        lVar3 = in_ST3;
        lVar11 = in_ST4;
        local_50 = dVar12;
      }
      in_ST4 = lVar10;
      in_ST3 = in_ST5;
      in_ST2 = lVar11;
      in_ST1 = lVar3;
      local_58 = (double)lVar9;
      if (lVar8 <= local_118) {
        dVar12 = local_58;
      }
      local_f0 = local_f0 + (local_128._0_8_ - dVar12);
      in_ST5 = in_ST4;
      local_d8 = uVar5;
      if (this->_V != 0) {
        uVar7 = 0;
        do {
          in_RCX = *(lanczos17m64 **)
                    &(this->_nkv).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data;
          local_60 = *(double *)(in_RCX + uVar7 * 8) +
                     (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
          lVar11 = in_ST5;
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)local_fd,&local_fe,(longdouble)local_60,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar8 = ABS(in_ST0);
          dVar12 = 0.0;
          lVar9 = in_ST2;
          lVar3 = in_ST4;
          local_128 = in_ST0;
          if (local_118 < lVar8) {
            local_108 = lVar8;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            dVar12 = (double)local_128;
            lVar8 = local_108;
            lVar9 = in_ST2;
            lVar3 = in_ST4;
            local_68 = dVar12;
          }
          in_ST4 = lVar11;
          in_ST2 = lVar3;
          in_ST0 = lVar9;
          local_70 = (double)local_128;
          if (lVar8 <= local_118) {
            dVar12 = local_70;
          }
          local_108 = (longdouble)CONCAT28(local_108._8_2_,dVar12);
          lVar11 = in_ST4;
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)local_fb,(detail *)(local_fd + 1),
                     (longdouble)
                     (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7],
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar8 = ABS(in_ST1);
          dVar12 = 0.0;
          lVar9 = in_ST3;
          lVar3 = in_ST5;
          local_128 = in_ST1;
          if (local_118 < lVar8) {
            local_e4 = lVar8;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            dVar12 = (double)local_128;
            lVar8 = local_e4;
            lVar9 = in_ST3;
            lVar3 = in_ST5;
            local_78 = dVar12;
          }
          in_ST5 = lVar11;
          in_ST3 = lVar3;
          in_ST1 = lVar9;
          local_80 = (double)local_128;
          if (lVar8 <= local_118) {
            dVar12 = local_80;
          }
          local_f0 = local_f0 + (local_108._0_8_ - dVar12);
          uVar7 = uVar7 + 1;
        } while (uVar7 < this->_V);
      }
      uVar5 = local_d8 + 1;
    } while (uVar5 < this->_K);
  }
  if (this->_D != 0) {
    local_f8 = 0.0;
    uVar5 = 0;
    local_118 = (longdouble)1.79769313486232e+308;
    do {
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_109,&local_10a,(longdouble)this->_alphaSum,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar8 = ABS(in_ST0);
      dVar12 = 0.0;
      if (local_118 < lVar8) {
        local_128 = in_ST0;
        local_108 = lVar8;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        dVar12 = (double)local_128;
        lVar8 = local_108;
        in_ST0 = local_128;
        local_88 = dVar12;
      }
      local_90 = (double)in_ST0;
      if (lVar8 <= local_118) {
        dVar12 = local_90;
      }
      local_128 = (longdouble)CONCAT28(local_128._8_2_,dVar12);
      local_98 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5] + this->_alphaSum;
      lVar10 = in_ST5;
      boost::math::detail::
      lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                ((longdouble *)&local_109,&local_10a,(longdouble)local_98,
                 (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  *)0x0,in_RCX,in_R8);
      lVar8 = ABS(in_ST1);
      dVar12 = 0.0;
      lVar9 = in_ST1;
      in_ST0 = in_ST2;
      lVar3 = in_ST3;
      lVar11 = in_ST4;
      if (local_118 < lVar8) {
        local_108 = in_ST1;
        local_e4 = lVar8;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
        dVar12 = (double)local_108;
        lVar8 = local_e4;
        lVar9 = local_108;
        in_ST0 = in_ST2;
        lVar3 = in_ST3;
        lVar11 = in_ST4;
        local_a0 = dVar12;
      }
      in_ST4 = lVar10;
      in_ST3 = in_ST5;
      in_ST2 = lVar11;
      in_ST1 = lVar3;
      local_a8 = (double)lVar9;
      if (lVar8 <= local_118) {
        dVar12 = local_a8;
      }
      local_f8 = local_f8 + (local_128._0_8_ - dVar12);
      in_ST5 = in_ST4;
      local_d8 = uVar5;
      if (this->_K != 0) {
        uVar7 = 0;
        do {
          in_RCX = *(lanczos17m64 **)
                    &(this->_ndk).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data;
          local_b0 = *(double *)(in_RCX + uVar7 * 8) +
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7];
          lVar11 = in_ST5;
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)&local_f9,(detail *)(local_fb + 1),(longdouble)local_b0,
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar8 = ABS(in_ST0);
          dVar12 = 0.0;
          lVar9 = in_ST2;
          lVar3 = in_ST4;
          local_128 = in_ST0;
          if (local_118 < lVar8) {
            local_108 = lVar8;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            dVar12 = (double)local_128;
            lVar8 = local_108;
            lVar9 = in_ST2;
            lVar3 = in_ST4;
            local_b8 = dVar12;
          }
          in_ST4 = lVar11;
          in_ST2 = lVar3;
          in_ST0 = lVar9;
          local_c0 = (double)local_128;
          if (lVar8 <= local_118) {
            dVar12 = local_c0;
          }
          local_108 = (longdouble)CONCAT28(local_108._8_2_,dVar12);
          lVar11 = in_ST4;
          boost::math::detail::
          lgamma_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>,boost::math::lanczos::lanczos17m64>
                    ((longdouble *)&local_129,&local_12a,
                     (longdouble)
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7],
                     (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)0x0,in_RCX,in_R8);
          lVar8 = ABS(in_ST1);
          dVar12 = 0.0;
          lVar9 = in_ST3;
          lVar3 = in_ST5;
          local_128 = in_ST1;
          if (local_118 < lVar8) {
            local_e4 = lVar8;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::lgamma<%1%>(%1%)","numeric overflow");
            dVar12 = (double)local_128;
            lVar8 = local_e4;
            lVar9 = in_ST3;
            lVar3 = in_ST5;
            local_c8 = dVar12;
          }
          in_ST5 = lVar11;
          in_ST3 = lVar3;
          in_ST1 = lVar9;
          local_d0 = (double)local_128;
          if (lVar8 <= local_118) {
            dVar12 = local_d0;
          }
          local_f8 = local_f8 + (local_108._0_8_ - dVar12);
          uVar7 = uVar7 + 1;
        } while (uVar7 < this->_K);
      }
      uVar5 = local_d8 + 1;
    } while (uVar5 < this->_D);
  }
  if ((this->_docVoca->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (this->_docVoca->
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    dVar12 = 0.0;
  }
  else {
    uVar5 = 0;
    dVar12 = 0.0;
    do {
      pvVar2 = (this->_docVoca->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_108 = (longdouble)CONCAT28(local_108._8_2_,uVar5);
      puVar4 = pvVar2[uVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar2[uVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != puVar4) {
        uVar7 = 0;
        do {
          if (this->_K != 0) {
            uVar1 = puVar4[uVar7];
            uVar6 = 0;
            do {
              __x = *(double *)
                     (*(long *)(*(long *)&(this->_qz).
                                          super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data + uVar7 * 0x18) +
                     uVar6 * 8);
              if ((__x != 0.0) || (NAN(__x))) {
                local_118 = (longdouble)CONCAT28(local_118._8_2_,__x);
                local_128._0_8_ = dVar12;
                dVar12 = log(__x);
                dVar12 = local_128._0_8_ +
                         (double)*(uint *)(*(long *)&(this->_frequencyMatrix->
                                                                                                          
                                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data +
                                          (ulong)uVar1 * 4) * dVar12 * local_118._0_8_;
                local_128 = (longdouble)CONCAT28(local_128._8_2_,dVar12);
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < this->_K);
          }
          uVar7 = uVar7 + 1;
          pvVar2 = (this->_docVoca->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar4 = pvVar2[uVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar2[uVar5].
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data + 8) - (long)puVar4
                                >> 2));
      }
      uVar5 = (long)local_108._0_8_ + 1;
      uVar7 = ((long)(this->_docVoca->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_docVoca->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
  }
  return (local_f0 + local_f8) - dVar12;
}

Assistant:

double VariationalBayesEstimatorOnLDA::calculateVariationalLowerBound()const{//{{{
    double term1=0, term2=0;
    for(int k=0; k<_K; k++){
        term1 += boost::math::lgamma(_betaSum) - boost::math::lgamma(_nk[k]+_betaSum);
        for(int v=0; v<_V; v++){
            try{
                term1 += boost::math::lgamma(_nkv[k][v]+_beta[v]) - boost::math::lgamma(_beta[v]);
            }catch(...){
                term1 += 0;
            }
        }
    }
    for(int d=0; d<_D; d++){
        term2 += boost::math::lgamma(_alphaSum) - boost::math::lgamma(_nd[d]+_alphaSum);
        for(int k=0; k<_K; k++){
        //ndk == 0 -> alphak == 0  lgamma(0) - lgamma(0) = 0
            try{
                term2 += boost::math::lgamma(_ndk[d][k]+_alpha[k]) - boost::math::lgamma(_alpha[k]);
            }catch(...){
                term2 += 0;
            }
        }
    }
    double term3 = 0;
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                if(_qz[d][l][k] != 0){
                    term3 += _qz[d][l][k] * log(_qz[d][l][k]) * _frequencyMatrix[d][v];
                }
            }
        }
    }
    double variationalLowerBound = term1 + term2 - term3;
    return(variationalLowerBound);
}